

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctime.c
# Opt level: O1

char * ctime(time_t *__timer)

{
  tm *__tp;
  char *pcVar1;
  
  __tp = localtime(__timer);
  if (__tp != (tm *)0x0) {
    pcVar1 = asctime(__tp);
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

char * ctime( const time_t * timer )
{
    /* Section 4.12.3.2 of X3.159-1989 requires that
        The ctime function converts the calendar time pointed to by timer
        to local time in the form of a string. It is equivalent to
            asctime(localtime(timer))
    */
    struct tm * tmp = localtime( timer );
    return tmp ? asctime( tmp ) : NULL;
}